

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

void __thiscall
icu_63::ReorderingBuffer::ReorderingBuffer
          (ReorderingBuffer *this,Normalizer2Impl *ni,UnicodeString *dest,UErrorCode *errorCode)

{
  char16_t *pcVar1;
  int32_t iVar2;
  
  this->impl = ni;
  this->str = dest;
  pcVar1 = UnicodeString::getBuffer(dest,8);
  this->start = pcVar1;
  this->reorderStart = pcVar1;
  this->limit = pcVar1;
  if (((this->str->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
    iVar2 = (this->str->fUnion).fFields.fCapacity;
  }
  else {
    iVar2 = 0x1b;
  }
  this->remainingCapacity = iVar2;
  this->lastCC = '\0';
  if ((pcVar1 == (char16_t *)0x0) && (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    *errorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  return;
}

Assistant:

ReorderingBuffer::ReorderingBuffer(const Normalizer2Impl &ni, UnicodeString &dest,
                                   UErrorCode &errorCode) :
        impl(ni), str(dest),
        start(str.getBuffer(8)), reorderStart(start), limit(start),
        remainingCapacity(str.getCapacity()), lastCC(0) {
    if (start == nullptr && U_SUCCESS(errorCode)) {
        // getBuffer() already did str.setToBogus()
        errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
}